

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::LifetimeTests::details::ResultCollector::addResult
          (ResultCollector *this,qpTestResult result,char *msg)

{
  ostringstream *this_00;
  undefined1 local_1a0 [384];
  
  local_1a0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// Fail: ");
  std::operator<<((ostream *)this_00,msg);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  if (this->m_result != QP_TEST_RESULT_PASS) {
    msg = "Multiple problems, see log for details";
    if (result != QP_TEST_RESULT_FAIL) goto LAB_014b5669;
    result = QP_TEST_RESULT_FAIL;
  }
  this->m_result = result;
LAB_014b5669:
  this->m_message = msg;
  return;
}

Assistant:

void ResultCollector::addResult (qpTestResult result, const char* msg)
{
	m_log << TestLog::Message << "// Fail: " << msg << TestLog::EndMessage;
	if (m_result == QP_TEST_RESULT_PASS)
	{
		m_result = result;
		m_message = msg;
	}
	else
	{
		if (result == QP_TEST_RESULT_FAIL)
			m_result = result;
		m_message = "Multiple problems, see log for details";
	}
}